

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui_fileselect.cc
# Opt level: O1

void __thiscall File_Selector::setup_display(File_Selector *this,WINDOW *outer)

{
  _Head_base<0UL,_File_Selector::Impl_*,_false> _Var1;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> __p;
  int iVar2;
  int iVar3;
  WINDOW *pWVar4;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> _Stack_40;
  __uniq_ptr_impl<_win_st,_WINDOW_deleter> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
  super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
       (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
  _Var1._M_head_impl =
       (this->P)._M_t.
       super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>._M_t.
       super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>.
       super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl;
  ((_Var1._M_head_impl)->win).outer_ = (WINDOW *)0x0;
  _Stack_40._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
  super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
       (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
  std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
            ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)((long)&(_Var1._M_head_impl)->win + 8),
             (pointer)0x0);
  __p._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>
  ._M_head_impl =
       local_38._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
       super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
  local_38._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
  super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
       (tuple<_win_st_*,_WINDOW_deleter>)(_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)0x0;
  std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
            ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)((long)&(_Var1._M_head_impl)->win + 0x10),
             (pointer)__p._M_t.super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
  std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
            ((unique_ptr<_win_st,_WINDOW_deleter> *)&local_38);
  std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
            ((unique_ptr<_win_st,_WINDOW_deleter> *)&_Stack_40);
  (((this->P)._M_t.
    super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>._M_t.
    super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>.
    super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl)->win).outer_ = outer;
  if (outer != (WINDOW *)0x0) {
    _Var1._M_head_impl =
         (this->P)._M_t.
         super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>._M_t.
         super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>.
         super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl;
    iVar2 = getcols(outer);
    pWVar4 = derwin_s(outer,1,iVar2 + -2,1,1);
    std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
              ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)((long)&(_Var1._M_head_impl)->win + 8),
               pWVar4);
    _Var1._M_head_impl =
         (this->P)._M_t.
         super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>._M_t.
         super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>.
         super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl;
    iVar2 = getrows(outer);
    iVar3 = getcols(outer);
    pWVar4 = derwin_s(outer,iVar2 + -4,iVar3 + -2,3,1);
    std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
              ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)((long)&(_Var1._M_head_impl)->win + 0x10)
               ,pWVar4);
  }
  return;
}

Assistant:

void File_Selector::setup_display(WINDOW *outer)
{
    P->win = Impl::Windows();
    P->win.outer_ = outer;

    if (!outer)
        return;

    P->win.title_.reset(derwin_s(outer, 1, getcols(outer) - 2, 1, 1));
    P->win.inner_.reset(derwin_s(outer, getrows(outer) - 4, getcols(outer) - 2, 3, 1));
}